

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_mapper.h
# Opt level: O2

void MMC1_init(nes_cartridge *cartridge)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)cartridge->mapper_state;
  bVar1 = *pbVar2;
  *pbVar2 = (bVar1 & 0xf8) + 3;
  pbVar2[8] = 0;
  pbVar2[9] = 0;
  pbVar2[10] = 0;
  pbVar2[0xb] = 0;
  pbVar2[0xc] = 0;
  pbVar2[0xd] = 0;
  pbVar2[0xe] = 0;
  pbVar2[0xf] = 0;
  *(ulong *)(pbVar2 + 0x10) = (ulong)((int)cartridge->prg_rom_size + 0x3c000U & 0x3ffff);
  pbVar2[0x18] = 0;
  pbVar2[0x19] = 0;
  pbVar2[0x1a] = 0;
  pbVar2[0x1b] = 0;
  pbVar2[0x1c] = 0;
  pbVar2[0x1d] = 0;
  pbVar2[0x1e] = 0;
  pbVar2[0x1f] = 0;
  pbVar2[0x20] = 0;
  pbVar2[0x21] = 0;
  pbVar2[0x22] = 0;
  pbVar2[0x23] = 0;
  pbVar2[0x24] = 0;
  pbVar2[0x25] = 0;
  pbVar2[0x26] = 0;
  pbVar2[0x27] = 0;
  pbVar2[0x22] = 0;
  pbVar2[0x23] = 0;
  pbVar2[0x24] = 0;
  pbVar2[0x25] = 0;
  pbVar2[0x26] = 0;
  pbVar2[0x27] = 0;
  pbVar2[0x28] = 0;
  pbVar2[0x29] = 0;
  pbVar2[0x2a] = 0;
  pbVar2[0x2b] = 0;
  pbVar2[0x2c] = 0;
  pbVar2[0x2d] = 0;
  pbVar2[0x2e] = 0;
  pbVar2[0x2f] = 0;
  pbVar2[0x30] = 0;
  pbVar2[0x31] = 0;
  *pbVar2 = bVar1 & 0xf8 | 0x1b;
  *pbVar2 = bVar1 & 0xd8 | 0x1b | (cartridge->prg_rom_size == 0x80000) << 5;
  return;
}

Assistant:

static void MMC1_init(nes_cartridge* cartridge)
{
    mmc1_mapper_state* state = (mmc1_mapper_state*)cartridge->mapper_state;
    state->bank_mode = 3;
    state->chr_bank_mode = 0;
    state->prg_bank_selector    = 0;
    state->fixed_bank_offset    = (cartridge->prg_rom_size - 0x4000) & 0x3FFFF;
    state->current_bank_offset  = 0;
    state->chr_bank_low_offset  = 0;
    state->chr_bank_high_offset = 0;
    state->shift_reg = 0;
    state->shift_count = 0;
    state->write_enable = 1;
    state->ram_enable = 1;
    state->is_SUROM = (cartridge->prg_rom_size == 512 * 1024);
}